

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ssl_ext_key_share_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  int iVar1;
  CBB entry;
  CBB ciphertext;
  CBB local_70;
  CBB local_40;
  
  if ((hs->pake_verifier)._M_t.
      super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl != (Verifier *)0x0) {
    return true;
  }
  iVar1 = CBB_add_u16(out,0x33);
  if ((((iVar1 != 0) && (iVar1 = CBB_add_u16_length_prefixed(out,&local_70), iVar1 != 0)) &&
      (iVar1 = CBB_add_u16(&local_70,
                           ((hs->new_session)._M_t.
                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->group_id),
      iVar1 != 0)) &&
     ((iVar1 = CBB_add_u16_length_prefixed(&local_70,&local_40), iVar1 != 0 &&
      (iVar1 = CBB_add_bytes(&local_40,(hs->key_share_ciphertext).data_,
                             (hs->key_share_ciphertext).size_), iVar1 != 0)))) {
    iVar1 = CBB_flush(out);
    return iVar1 != 0;
  }
  return false;
}

Assistant:

bool ssl_ext_key_share_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  if (hs->pake_verifier) {
    // We don't add the key share extension if a PAKE is offered.
    return true;
  }

  CBB entry, ciphertext;
  if (!CBB_add_u16(out, TLSEXT_TYPE_key_share) ||
      !CBB_add_u16_length_prefixed(out, &entry) ||
      !CBB_add_u16(&entry, hs->new_session->group_id) ||
      !CBB_add_u16_length_prefixed(&entry, &ciphertext) ||
      !CBB_add_bytes(&ciphertext, hs->key_share_ciphertext.data(),
                     hs->key_share_ciphertext.size()) ||
      !CBB_flush(out)) {
    return false;
  }
  return true;
}